

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_kx_n(void)

{
  _Bool _Var1;
  hydro_kx_session_keypair kp_server;
  hydro_kx_session_keypair kp_client;
  uint8_t packet1 [48];
  uint8_t psk [32];
  hydro_kx_keypair server_static_kp;
  undefined1 auStack_118 [16];
  size_t in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  undefined1 auStack_f8 [32];
  undefined1 local_d8 [32];
  undefined1 auStack_b8 [40];
  hydro_kx_keypair *in_stack_ffffffffffffff70;
  uint8_t *in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  hydro_kx_session_keypair *in_stack_ffffffffffffff88;
  
  hydro_kx_keygen((hydro_kx_keypair *)0x102ef4);
  hydro_random_buf(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  hydro_kx_n_1(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70->pk);
  hydro_kx_n_2(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70);
  _Var1 = hydro_equal(auStack_b8,auStack_118,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x140,"void test_kx_n(void)");
  }
  _Var1 = hydro_equal(local_d8,auStack_f8,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x141,"void test_kx_n(void)");
  }
  return;
}

Assistant:

static void
test_kx_n(void)
{
    hydro_kx_keypair         server_static_kp;
    uint8_t                  psk[hydro_kx_PSKBYTES];
    uint8_t                  packet1[hydro_kx_N_PACKET1BYTES];
    hydro_kx_session_keypair kp_client;
    hydro_kx_session_keypair kp_server;

    hydro_kx_keygen(&server_static_kp);
    hydro_random_buf(psk, sizeof psk);

    hydro_kx_n_1(&kp_client, packet1, psk, server_static_kp.pk);
    hydro_kx_n_2(&kp_server, packet1, psk, &server_static_kp);

    assert(hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES));
    assert(hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES));
}